

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O1

_Bool xdr_dplx_decode(XDR *xdrs,rpc_msg *dmsg)

{
  uint uVar1;
  uint *puVar2;
  _Bool _Var3;
  uint *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  puVar4 = (uint *)xdrs->x_data;
  puVar2 = (uint *)(xdrs->x_v).vio_tail;
  if (puVar2 < puVar4 + 5) {
    puVar4 = (uint *)0x0;
  }
  else {
    xdrs->x_data = (uint8_t *)(puVar4 + 5);
  }
  if (puVar4 == (uint *)0x0) {
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if (puVar2 < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&dmsg->rm_xid);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar6 = "%s:%u ERROR rm_xid";
        uVar5 = 0x1bd;
        goto LAB_001134b7;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      dmsg->rm_xid = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&dmsg->rm_direction);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar6 = "%s:%u ERROR rm_direction";
        uVar5 = 0x1c3;
LAB_001134b7:
        (*__ntirpc_pkg_params.warnx_)(pcVar6,"xdr_dplx_decode",uVar5);
        return false;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      dmsg->rm_direction =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    puVar4 = (uint *)0x0;
  }
  else {
    uVar1 = *puVar4;
    dmsg->rm_xid = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar4[1];
    puVar4 = puVar4 + 2;
    dmsg->rm_direction =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  if (dmsg->rm_direction == REPLY) {
    _Var3 = xdr_reply_decode(xdrs,dmsg,(int32_t *)puVar4);
    return _Var3;
  }
  if (dmsg->rm_direction != CALL) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_direction (%u)","xdr_dplx_decode",0x1d0);
    }
    return false;
  }
  _Var3 = xdr_call_decode(xdrs,dmsg,(int32_t *)puVar4);
  return _Var3;
}

Assistant:

bool
xdr_dplx_decode(XDR *xdrs, struct rpc_msg *dmsg)
{
	int32_t *buf;

	/*
	 * NOTE: 5 here, 3 more in each _decode
	 */
	buf = xdr_inline_decode(xdrs, 5 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		dmsg->rm_xid = IXDR_GET_U_INT32(buf);
		dmsg->rm_direction = IXDR_GET_ENUM(buf, enum msg_type);
	} else {
		if (!xdr_getuint32(xdrs, &(dmsg->rm_xid))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_direction))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_direction) {
	case CALL:
		return (xdr_call_decode(xdrs, dmsg, buf));
	case REPLY:
		return (xdr_reply_decode(xdrs, dmsg, buf));
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_direction (%u)",
			__func__, __LINE__,
			dmsg->rm_direction);
		break;
	};

	return (false);
}